

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCallFunctionAction_UnloadSnapshot(EventLogEntry *evt)

{
  JsRTCallFunctionAction *pJVar1;
  JsRTCallFunctionAction *cfAction;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  if ((pJVar1->AdditionalReplayInfo != (JsRTCallFunctionAction_ReplayAdditionalInfo *)0x0) &&
     (pJVar1->AdditionalReplayInfo->RtRSnap != (SnapShot *)0x0)) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::SnapShot>
              (&Memory::HeapAllocator::Instance,pJVar1->AdditionalReplayInfo->RtRSnap);
    pJVar1->AdditionalReplayInfo->RtRSnap = (SnapShot *)0x0;
  }
  return;
}

Assistant:

void JsRTCallFunctionAction_UnloadSnapshot(EventLogEntry* evt)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            if(cfAction->AdditionalReplayInfo != nullptr && cfAction->AdditionalReplayInfo->RtRSnap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, cfAction->AdditionalReplayInfo->RtRSnap);
                cfAction->AdditionalReplayInfo->RtRSnap = nullptr;
            }
        }